

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O0

ion_bpp_err_t b_get(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t *rec)

{
  ion_bpp_address_t adr;
  int iVar1;
  ion_bpp_err_t iVar2;
  ion_bpp_h_node_t *h;
  ion_bpp_buffer_t *piStack_38;
  ion_bpp_err_t rc;
  ion_bpp_buffer_t *buf;
  ion_bpp_key_t *mkey;
  ion_bpp_external_address_t *rec_local;
  void *key_local;
  ion_bpp_handle_t handle_local;
  
  piStack_38 = (ion_bpp_buffer_t *)((long)handle + 0x20);
  mkey = (ion_bpp_key_t *)rec;
  rec_local = (ion_bpp_external_address_t *)key;
  key_local = handle;
  do {
    while( true ) {
      if ((undefined1  [40])((undefined1  [40])*piStack_38->p & (undefined1  [40])0x1) !=
          (undefined1  [40])0x0) {
        iVar1 = search(key_local,piStack_38,rec_local,0,(ion_bpp_key_t **)&buf,MODE_FIRST);
        if (iVar1 == 0) {
          *(undefined8 *)mkey = *(undefined8 *)((long)&buf->next + (long)*(int *)((long)handle + 8))
          ;
          *(ion_bpp_buffer_t **)((long)handle + 0xa8) = piStack_38;
          *(ion_bpp_buffer_t **)((long)handle + 0xb0) = buf;
          return bErrOk;
        }
        return bErrKeyNotFound;
      }
      iVar1 = search(key_local,piStack_38,rec_local,0,(ion_bpp_key_t **)&buf,MODE_MATCH);
      if (iVar1 < 0) break;
      iVar2 = readDisk(key_local,
                       *(ion_bpp_address_t *)((long)&buf->prev + (long)*(int *)((long)handle + 8)),
                       &stack0xffffffffffffffc8);
      if (iVar2 != bErrOk) {
        return iVar2;
      }
    }
    adr._0_4_ = buf[-1].valid;
    adr._4_4_ = buf[-1].modified;
    iVar2 = readDisk(key_local,adr,&stack0xffffffffffffffc8);
  } while (iVar2 == bErrOk);
  return iVar2;
}

Assistant:

ion_bpp_err_t
b_get(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	*rec
) {
	ion_bpp_key_t		*mkey;			/* matched key */
	ion_bpp_buffer_t	*buf;				/* buffer */
	ion_bpp_err_t		rc;			/* return code */

	ion_bpp_h_node_t *h = handle;

	buf = &h->root;

	/* find key, and return address */
	while (1) {
		if (leaf(buf)) {
			if (search(handle, buf, key, 0, &mkey, MODE_FIRST) == 0) {
				*rec		= rec(mkey);
				h->curBuf	= buf;
				h->curKey	= mkey;
				return bErrOk;
			}
			else {
				return bErrKeyNotFound;
			}
		}
		else {
			if (search(handle, buf, key, 0, &mkey, MODE_MATCH) < 0) {
				if ((rc = readDisk(handle, childLT(mkey), &buf)) != 0) {
					return rc;
				}
			}
			else {
				if ((rc = readDisk(handle, childGE(mkey), &buf)) != 0) {
					return rc;
				}
			}
		}
	}
}